

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Options::TestCaseOptionParser::optionDescription_abi_cxx11_
          (string *__return_storage_ptr__,TestCaseOptionParser *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "This option allows one ore more test specs to be supplied. Each spec either fully specifies a test case or is a pattern containing wildcards to match a set of test cases. If this option is not provided then all test cases, except those prefixed by \'./\' are run\n\nSpecs must be enclosed in \"quotes\" if they contain spaces. If they do not contain spaces the quotes are optional.\n\nWildcards consist of the * character at the beginning, end, or both and can substitute for any number of any characters (including none)\n\nIf spec is prefixed with exclude: or the ~ character then the pattern matches an exclusion. This means that tests matching the pattern are excluded from the set - even if a prior inclusion spec included them. Subsequent inclusion specs will take precedence, however. Inclusions and exclusions are evaluated in left-to-right order.\n\nExamples:\n\n    -t thisTestOnly        \tMatches the test case called, \'thisTestOnly\'\n    -t \"this test only\"    \tMatches the test case called, \'this test only\'\n    -t these/*             \tMatches all cases starting with \'these/\'\n    -t exclude:notThis     \tMatches all tests except, \'notThis\'\n    -t ~notThis            \tMatches all tests except, \'notThis\'\n    -t ~*private*          \tMatches all tests except those that contain \'private\'\n    -t a/* ~a/b/* a/b/c    \tMatches all tests that start with \'a/\', except those that start with \'a/b/\', except \'a/b/c\', which is included"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string optionDescription() const {
                return
                    "This option allows one ore more test specs to be supplied. Each spec either fully "
                    "specifies a test case or is a pattern containing wildcards to match a set of test "
                    "cases. If this option is not provided then all test cases, except those prefixed "
                    "by './' are run\n"
                    "\n"
                    "Specs must be enclosed in \"quotes\" if they contain spaces. If they do not "
                    "contain spaces the quotes are optional.\n"
                    "\n"
                    "Wildcards consist of the * character at the beginning, end, or both and can substitute for "
                    "any number of any characters (including none)\n"
                    "\n"
                    "If spec is prefixed with exclude: or the ~ character then the pattern matches an exclusion. "
                    "This means that tests matching the pattern are excluded from the set - even if a prior "
                    "inclusion spec included them. Subsequent inclusion specs will take precedence, however. "
                    "Inclusions and exclusions are evaluated in left-to-right order.\n"
                    "\n"
                    "Examples:\n"
                    "\n"
                    "    -t thisTestOnly        \tMatches the test case called, 'thisTestOnly'\n"
                    "    -t \"this test only\"    \tMatches the test case called, 'this test only'\n"
                    "    -t these/*             \tMatches all cases starting with 'these/'\n"
                    "    -t exclude:notThis     \tMatches all tests except, 'notThis'\n"
                    "    -t ~notThis            \tMatches all tests except, 'notThis'\n"
                    "    -t ~*private*          \tMatches all tests except those that contain 'private'\n"
                    "    -t a/* ~a/b/* a/b/c    \tMatches all tests that start with 'a/', except those "
                                                 "that start with 'a/b/', except 'a/b/c', which is included";
            }